

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall
flow::lang::LiteralExpr<long_long>::LiteralExpr(LiteralExpr<long_long> *this,longlong *value)

{
  SourceLocation local_50;
  longlong *local_18;
  longlong *value_local;
  LiteralExpr<long_long> *this_local;
  
  local_18 = value;
  value_local = (longlong *)this;
  SourceLocation::SourceLocation(&local_50);
  LiteralExpr(this,value,&local_50);
  SourceLocation::~SourceLocation(&local_50);
  return;
}

Assistant:

explicit LiteralExpr(const T& value)
      : LiteralExpr(value, SourceLocation()) {}